

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_insert(btree *btree,void *key,void *value)

{
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  ushort uVar4;
  btree_print_func *pbVar5;
  void *pvVar6;
  _func_voidref_void_ptr_bid_t *p_Var7;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var8;
  _func_bid_t_void_ptr *p_Var9;
  void *pvVar10;
  code *pcVar11;
  _func_voidref_bid_t_ptr *p_Var12;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var13;
  _func_int_void_ptr_bid_t *p_Var14;
  _func_void_void_ptr_bid_t *p_Var15;
  _func_voidref_void_ptr_bid_t_bid_t_ptr *p_Var16;
  _func_void_void_ptr *p_Var17;
  list_elem *plVar18;
  list_elem *plVar19;
  bool bVar20;
  uint uVar21;
  bnode **node;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var22;
  idx_t iVar23;
  int iVar24;
  kv_ins_item *pkVar25;
  voidref pvVar26;
  bnode *pbVar27;
  bid_t bVar28;
  size_t sVar29;
  list_elem *plVar30;
  undefined4 uVar31;
  long lVar32;
  ulong uVar33;
  bnode **ppbVar34;
  ulong uVar35;
  bid_t *pbVar36;
  undefined1 *puVar37;
  idx_t *piVar38;
  long lVar39;
  list *plVar40;
  list_elem *plVar41;
  bnode *apbStack_120 [9];
  list lStack_d8;
  bid_t _bid;
  bid_t new_bid;
  size_t local_b8;
  size_t nodesize;
  idx_t *local_a8;
  uint local_a0;
  undefined4 local_9c;
  long local_98;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *local_90;
  long local_88;
  long local_80;
  uint local_74;
  void *local_70;
  list *local_68;
  bnode **local_60;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *local_58;
  uint local_4c;
  void *local_48;
  bid_t *local_40;
  char local_31;
  
  local_48 = (void *)((long)&lStack_d8 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  local_70 = (void *)((long)local_48 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar4 = btree->height;
  piVar38 = (idx_t *)((long)local_70 - (ulong)((uint)uVar4 * 2 + 0xf & 0xfffffff0));
  uVar35 = (ulong)((uint)uVar4 * 8 + 0xf & 0xfffffff0);
  pbVar36 = (bid_t *)((long)piVar38 - uVar35);
  uVar33 = (ulong)(uVar4 + 0xf & 0xfffffff0);
  lVar39 = (long)pbVar36 - uVar33;
  local_98 = lVar39 - uVar33;
  puVar37 = (undefined1 *)(local_98 - uVar33);
  local_88 = (long)puVar37 - uVar33;
  local_68 = (list *)(local_88 + (ulong)uVar4 * -0x10);
  ppbVar34 = (bnode **)((long)local_68 - uVar35);
  local_60 = ppbVar34;
  local_58 = (_func_void_bnode_ptr_idx_t_void_ptr_void_ptr *)key;
  for (uVar35 = 0; pvVar10 = local_48, pvVar6 = local_70, uVar4 != uVar35; uVar35 = uVar35 + 1) {
    *(undefined1 *)(local_88 + uVar35) = 0;
    puVar37[uVar35] = 0;
    *(undefined1 *)(lVar39 + uVar35) = 0;
    *(undefined1 *)(local_98 + uVar35) = 0;
  }
  pbVar5 = btree->kv_ops->init_kv_var;
  local_40 = pbVar36;
  if (pbVar5 != (btree_print_func *)0x0) {
    ppbVar34[-1] = (bnode *)0x11948a;
    (*pbVar5)(btree,pvVar10,pvVar6);
    uVar4 = btree->height;
    for (lVar32 = 0; (ulong)uVar4 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
      puVar1 = (undefined8 *)((long)&local_68->head + lVar32);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
  }
  p_Var8 = local_58;
  local_80 = lVar39;
  ppbVar34[-1] = (bnode *)0x1194bc;
  pkVar25 = _kv_ins_item_create(btree,p_Var8,value);
  plVar40 = local_68;
  ppbVar34[-1] = (bnode *)0x1194c9;
  list_push_back(plVar40,&pkVar25->le);
  nodesize = (size_t)puVar37;
  *puVar37 = 1;
  uVar4 = btree->height;
  local_40[(ulong)uVar4 - 1] = btree->root_bid;
  uVar35 = (ulong)uVar4;
  while (uVar33 = uVar35, uVar35 = uVar33 - 1, uVar33 != 0) {
    pvVar6 = btree->blk_handle;
    bVar28 = local_40[uVar35];
    p_Var7 = btree->blk_ops->blk_read;
    ppbVar34[-1] = (bnode *)0x119507;
    pvVar26 = (*p_Var7)(pvVar6,bVar28);
    ppbVar34[-1] = (bnode *)0x119516;
    pbVar27 = _fetch_bnode(btree,pvVar26,(uint16_t)uVar33);
    p_Var8 = local_58;
    local_60[uVar35] = pbVar27;
    ppbVar34[-1] = (bnode *)0x119530;
    iVar23 = _btree_find_entry(btree,pbVar27,p_Var8);
    piVar38[uVar35] = iVar23;
    if (uVar33 != 1) {
      if (iVar23 == 0xffff) {
        piVar38[uVar35] = 0;
        iVar23 = 0;
      }
      pvVar10 = local_48;
      pvVar6 = local_70;
      p_Var8 = btree->kv_ops->get_kv;
      ppbVar34[-1] = (bnode *)0x119566;
      (*p_Var8)(pbVar27,iVar23,pvVar10,pvVar6);
      p_Var9 = btree->kv_ops->value2bid;
      ppbVar34[-1] = (bnode *)0x119570;
      bVar28 = (*p_Var9)(pvVar6);
      local_40[uVar33 - 2] =
           bVar28 >> 0x38 | (bVar28 & 0xff000000000000) >> 0x28 | (bVar28 & 0xff0000000000) >> 0x18
           | (bVar28 & 0xff00000000) >> 8 | (bVar28 & 0xff000000) << 8 | (bVar28 & 0xff0000) << 0x18
           | (bVar28 & 0xff00) << 0x28 | bVar28 << 0x38;
    }
  }
  uVar35 = 0;
  local_4c = 0;
  local_a8 = piVar38;
  do {
    pvVar6 = local_48;
    new_bid = (ulong)btree->height;
    if (btree->height <= uVar35) {
LAB_0011992c:
      p_Var17 = btree->blk_ops->blk_operation_end;
      if (p_Var17 != (_func_void_void_ptr *)0x0) {
        pvVar6 = btree->blk_handle;
        ppbVar34[-1] = (bnode *)0x11993f;
        (*p_Var17)(pvVar6);
      }
      pvVar10 = local_48;
      pvVar6 = local_70;
      pbVar5 = btree->kv_ops->free_kv_var;
      if (pbVar5 != (btree_print_func *)0x0) {
        ppbVar34[-1] = (bnode *)0x119959;
        (*pbVar5)(btree,pvVar10,pvVar6);
      }
      local_40 = (bid_t *)-(ulong)(uVar35 < new_bid);
      for (lVar39 = 0; lVar39 < (long)((ulong)btree->height + (long)local_40); lVar39 = lVar39 + 1)
      {
        plVar40 = local_68 + lVar39;
        plVar41 = local_68[lVar39].head;
        while (plVar41 != (list_elem *)0x0) {
          ppbVar34[-1] = (bnode *)0x11999f;
          plVar30 = list_remove(plVar40,plVar41);
          pbVar5 = btree->kv_ops->free_kv_var;
          if (pbVar5 != (btree_print_func *)0x0) {
            plVar18 = plVar41[-1].prev;
            plVar19 = plVar41[-1].next;
            ppbVar34[-1] = (bnode *)0x1199bc;
            (*pbVar5)(btree,plVar18,plVar19);
          }
          ppbVar34[-1] = (bnode *)0x1199c8;
          _kv_ins_item_free((kv_ins_item *)(plVar41 + -1));
          plVar41 = plVar30;
        }
      }
      return (btree_result)(local_4c != 0);
    }
    uVar4 = local_a8[uVar35];
    local_74 = (uint)uVar4;
    if (uVar4 == 0xffff) {
      if (uVar35 != 0) goto LAB_00119616;
      bVar20 = false;
      pbVar36 = local_40;
    }
    else {
      pbVar27 = local_60[uVar35];
      bVar20 = false;
      pbVar36 = (bid_t *)0x0;
      p_Var8 = btree->kv_ops->get_kv;
      ppbVar34[-1] = (bnode *)0x1195d8;
      (*p_Var8)(pbVar27,uVar4,pvVar6,(void *)0x0);
      pvVar6 = local_48;
      p_Var8 = local_58;
      if (uVar35 != 0) {
        if (uVar4 == 0) {
          pvVar10 = btree->aux;
          pcVar11 = (code *)btree->kv_ops->cmp;
          ppbVar34[-1] = (bnode *)0x1195fe;
          iVar24 = (*pcVar11)(p_Var8,pvVar6,pvVar10);
          if (iVar24 < 0) {
            *(undefined1 *)(local_88 + uVar35) = 1;
          }
        }
LAB_00119616:
        bVar20 = true;
        pbVar36 = local_40;
        if (*(char *)((uVar35 - 1) + local_98) != '\0') {
          uVar33 = local_40[uVar35 - 1];
          lStack_d8.tail =
               (list_elem *)
               (uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 | (uVar33 & 0xff00) << 0x28
               | uVar33 << 0x38);
          local_90 = btree->kv_ops->set_kv;
          pbVar27 = local_60[uVar35];
          p_Var12 = btree->kv_ops->bid2value;
          ppbVar34[-1] = (bnode *)0x119658;
          pbVar36 = (bid_t *)(*p_Var12)((bid_t *)&lStack_d8.tail);
          pvVar6 = local_48;
          uVar21 = local_74;
          p_Var8 = local_90;
          ppbVar34[-1] = (bnode *)0x11966b;
          (*p_Var8)(pbVar27,(idx_t)uVar21,pvVar6,pbVar36);
          *(undefined1 *)(local_80 + uVar35) = 1;
        }
      }
    }
    pvVar6 = local_48;
    cVar2 = *(char *)(nodesize + uVar35);
    cVar3 = *(char *)(local_88 + uVar35);
    uVar31 = (undefined4)CONCAT71((int7)((ulong)pbVar36 >> 8),cVar3 == '\0');
    if (cVar2 == '\0') {
      lVar39 = local_80;
      if (cVar3 != '\0') {
        uVar31 = 0;
        local_90 = local_58;
        goto LAB_001196cc;
      }
    }
    else {
      local_90 = local_58;
      if (cVar3 == '\0') {
        local_90 = (_func_void_bnode_ptr_idx_t_void_ptr_void_ptr *)0x0;
      }
LAB_001196cc:
      local_4c = 0;
      local_9c = uVar31;
      local_31 = cVar2;
      if (uVar4 != 0xffff && !bVar20) {
        plVar41 = local_68[uVar35].head[-1].prev;
        pvVar10 = btree->aux;
        pcVar11 = (code *)btree->kv_ops->cmp;
        ppbVar34[-1] = (bnode *)0x119708;
        iVar24 = (*pcVar11)(plVar41,pvVar6,pvVar10);
        local_4c = (uint)(iVar24 == 0);
      }
      plVar40 = local_68 + uVar35;
      pbVar27 = local_60[uVar35];
      local_a0 = (uint)(uVar35 + 1) & 0xffff;
      pbVar36 = local_40;
      while( true ) {
        p_Var8 = local_90;
        bVar28 = pbVar36[uVar35];
        ppbVar34[-1] = (bnode *)0x119757;
        iVar24 = _bnode_size_check(btree,bVar28,pbVar27,p_Var8,plVar40,&local_b8);
        sVar29 = local_b8;
        if (iVar24 != 0 || local_4c != 0) break;
        p_Var13 = btree->blk_ops->blk_enlarge_node;
        if ((p_Var13 == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0) ||
           (bVar28 = local_40[uVar35], (char)(bVar28 >> 0x30) == '\0')) {
LAB_001197e5:
          node = local_60;
          sVar29 = local_b8;
          local_60[uVar35] = pbVar27;
          ppbVar34[-1] = (bnode *)0xffffffffffffffff;
          bVar28 = (bid_t)ppbVar34[-1];
          ppbVar34[-1] = (bnode *)0x119802;
          sVar29 = _btree_get_nsplitnode(btree,bVar28,pbVar27,sVar29);
          ppbVar34[-1] = (bnode *)0x2;
          pbVar36 = local_40;
          p_Var8 = local_58;
          piVar38 = local_a8;
          if (sVar29 == 1) {
            sVar29 = (size_t)ppbVar34[-1];
          }
          ppbVar34[-2] = (bnode *)nodesize;
          ppbVar34[-3] = (bnode *)local_88;
          lVar39 = local_80;
          ppbVar34[-4] = (bnode *)local_80;
          ppbVar34[-5] = (bnode *)local_70;
          ppbVar34[-6] = (bnode *)local_48;
          ppbVar34[-7] = (bnode *)sVar29;
          ppbVar34[-8] = (bnode *)local_68;
          ppbVar34[-9] = (bnode *)0x119847;
          iVar24 = _btree_split_node(btree,p_Var8,node,pbVar36,piVar38,(int)uVar35,
                                     (list *)ppbVar34[-8],(size_t)ppbVar34[-7],ppbVar34[-6],
                                     ppbVar34[-5],(int8_t *)ppbVar34[-4],(int8_t *)ppbVar34[-3],
                                     (int8_t *)ppbVar34[-2]);
          if (iVar24 != 0) goto LAB_0011992c;
          goto LAB_001198c4;
        }
        pvVar6 = btree->blk_handle;
        ppbVar34[-1] = (bnode *)0x119794;
        pvVar26 = (*p_Var13)(pvVar6,bVar28,sVar29,&_bid);
        pbVar36 = local_40;
        uVar21 = local_a0;
        if (pvVar26 == (voidref)0x0) goto LAB_001197e5;
        *(undefined1 *)(local_98 + uVar35) = 1;
        local_40[uVar35] = _bid;
        ppbVar34[-1] = (bnode *)0x1197c5;
        pbVar27 = _fetch_bnode(btree,pvVar26,(uint16_t)uVar21);
        if (uVar35 + 1 == (ulong)btree->height) {
          btree->root_bid = pbVar36[uVar35];
        }
      }
      local_60[uVar35] = pbVar27;
      if (local_31 != '\0') {
        while (plVar41 = plVar40->head, plVar41 != (list_elem *)0x0) {
          plVar30 = plVar41[-1].prev;
          plVar18 = plVar41[-1].next;
          ppbVar34[-1] = (bnode *)0x11987d;
          _btree_add_entry(btree,pbVar27,plVar30,plVar18);
          plVar40 = (list *)&plVar41->next;
        }
      }
      pvVar10 = local_48;
      pvVar6 = local_70;
      uVar21 = local_74;
      if ((char)local_9c == '\0') {
        p_Var8 = btree->kv_ops->get_kv;
        ppbVar34[-1] = (bnode *)0x1198a7;
        (*p_Var8)(pbVar27,(idx_t)uVar21,pvVar10,pvVar6);
        p_Var22 = local_58;
        p_Var8 = btree->kv_ops->set_kv;
        ppbVar34[-1] = (bnode *)0x1198bb;
        (*p_Var8)(pbVar27,(idx_t)uVar21,p_Var22,pvVar6);
      }
      *(undefined1 *)(local_80 + uVar35) = 1;
      lVar39 = local_80;
    }
LAB_001198c4:
    pbVar36 = local_40;
    if (*(char *)(lVar39 + uVar35) != '\0') {
      pvVar6 = btree->blk_handle;
      bVar28 = local_40[uVar35];
      p_Var14 = btree->blk_ops->blk_is_writable;
      ppbVar34[-1] = (bnode *)0x1198de;
      iVar24 = (*p_Var14)(pvVar6,bVar28);
      pvVar6 = btree->blk_handle;
      bVar28 = pbVar36[uVar35];
      if (iVar24 == 0) {
        pbVar36 = pbVar36 + uVar35;
        p_Var16 = btree->blk_ops->blk_move;
        ppbVar34[-1] = (bnode *)0x1198fd;
        (*p_Var16)(pvVar6,bVar28,pbVar36);
        *(undefined1 *)(local_98 + uVar35) = 1;
        if (uVar35 + 1 == (ulong)btree->height) {
          btree->root_bid = *pbVar36;
        }
      }
      else {
        p_Var15 = btree->blk_ops->blk_set_dirty;
        ppbVar34[-1] = (bnode *)0x1198f1;
        (*p_Var15)(pvVar6,bVar28);
      }
    }
    uVar35 = uVar35 + 1;
  } while( true );
}

Assistant:

btree_result btree_insert(struct btree *btree, void *key, void *value)
{
    void *addr;
    size_t nsplitnode = 1;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *ins = alca(int8_t, btree->height);
    int8_t *minkey_replace = alca(int8_t, btree->height);
    int8_t height_growup;

    // key, value to be inserted
    struct list *kv_ins_list = alca(struct list, btree->height);
    struct kv_ins_item *kv_item;
    struct list_elem *e;

    // index# where kv is inserted
    idx_t *idx_ins = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i, j, _is_update = 0;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = ins[i] = minkey_replace[i] = 0;
    }
    height_growup = 0;

    // initialize temporary variables
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        for (i=0;i<btree->height;++i){
            list_init(&kv_ins_list[i]);
        }
    }

    // copy key-value pair to be inserted into leaf node
    kv_item = _kv_ins_item_create(btree, key, value);
    list_push_back(&kv_ins_list[0], &kv_item->le);

    ins[0] = 1;

    // set root node
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i){
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (i > 0) {
            // index (non-leaf) node
            if (idx[i] == BTREE_IDX_NOT_FOUND)
                // KEY is smaller than the smallest key in this node ..
                // just follow the smallest key
                idx[i] = 0;

            // get bid of child node from value
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node .. do nothing
        }
    }

    // cascaded insert from leaf to root
    for (i=0;i<btree->height;++i){

        if (idx[i] != BTREE_IDX_NOT_FOUND)
            btree->kv_ops->get_kv(node[i], idx[i], k, NULL);

        if (i > 0) {
            // in case of index node
            // when KEY is smaller than smallest key in index node
            if (idx[i] == 0 && btree->kv_ops->cmp(key, k, btree->aux) < 0) {
                // change node's smallest key
                minkey_replace[i] = 1;
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (ins[i] || minkey_replace[i]) {
            // there is a key-value pair to be inserted into this (level of)
            // node check whether btree node space is enough to add new
            // key-value pair or not, OR action is not insertion but update
            // (key_ins exists in current node)
            _is_update = 0;
            size_t nodesize;
            void *new_minkey = (minkey_replace[i])?(key):(NULL);

            if (i==0) {
                e = list_begin(&kv_ins_list[i]);
                kv_item = _get_entry(e, struct kv_ins_item, le);
                _is_update =
                    (idx[i] != BTREE_IDX_NOT_FOUND &&
                     !btree->kv_ops->cmp(kv_item->key, k, btree->aux));
            }

        check_node:;
            int _size_check =
                _bnode_size_check(btree, bid[i], node[i], new_minkey,
                                  &kv_ins_list[i], &nodesize);

            if (_size_check || _is_update ) {
                //2 enough space
                if (ins[i]) {
                    // insert key/value pair(s)
                    // insert all kv pairs on list
                    e = list_begin(&kv_ins_list[i]);
                    while(e) {
                        kv_item = _get_entry(e, struct kv_ins_item, le);
                        idx_ins[i] = _btree_add_entry(btree, node[i],
                                                 kv_item->key, kv_item->value);
                        e = list_next(e);
                    }
                }
                if (minkey_replace[i]) {
                    // replace the minimum key in the node to KEY
                    btree->kv_ops->get_kv(node[i], idx[i], k, v);
                    btree->kv_ops->set_kv(node[i], idx[i], key, v);
                }
                modified[i] = 1;

            }else{
                //2 not enough
                // first check if the node can be enlarged
                if (btree->blk_ops->blk_enlarge_node &&
                    is_subblock(bid[i])) {
                    bid_t new_bid;
                    addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                        bid[i], nodesize, &new_bid);
                    if (addr) {
                        // the node can be enlarged .. fetch the enlarged node
                        moved[i] = 1;
                        bid[i] = new_bid;
                        node[i] = _fetch_bnode(btree, addr, i+1);
                        if (i+1 == btree->height) {
                            // if moved node is root node
                            btree->root_bid = bid[i];
                        }
                        // start over
                        goto check_node;
                    }
                }

                //otherwise, split the node
                nsplitnode = _btree_get_nsplitnode(btree, BLK_NOT_FOUND,
                                                   node[i], nodesize);
                // force the node split when the node size of new layout is
                // larger than the current node size
                if (nsplitnode == 1) nsplitnode = 2;

                height_growup = _btree_split_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, nsplitnode, k, v,
                    modified, minkey_replace, ins);
            } // split
        } // insert

        if (height_growup) break;

        if (modified[i]) {
            //2 when the node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // not writable .. already flushed block -> cannot overwrite,
                // we have to move to new block
                height_growup = _btree_move_modified_node(
                    btree, key, node, bid, idx, i,
                    kv_ins_list, k, v,
                    modified, minkey_replace, ins, moved);

                if (height_growup) break;
            }else{
                // writable .. just set dirty to write back into storage
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            } // is writable
        } // is modified
    } // for loop

    // release temporary resources
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);

    for (j=0; j < ((height_growup)?(btree->height-1):(btree->height)); ++j){
        e = list_begin(&kv_ins_list[j]);
        while(e) {
            kv_item = _get_entry(e, struct kv_ins_item, le);
            e = list_remove(&kv_ins_list[j], e);

            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, kv_item->key, kv_item->value);
            }
            _kv_ins_item_free(kv_item);
        }
    }

    if (_is_update) {
        return BTREE_RESULT_UPDATE;
    }else{
        return BTREE_RESULT_SUCCESS;
    }
}